

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O1

void __thiscall xmrig::Console::stop(Console *this)

{
  uv_tty_t *puVar1;
  int iVar2;
  
  if (this->m_tty != (uv_tty_t *)0x0) {
    uv_tty_reset_mode();
    puVar1 = this->m_tty;
    if (puVar1 != (uv_tty_t *)0x0) {
      iVar2 = uv_is_closing(puVar1);
      if (iVar2 == 0) {
        uv_close(puVar1,Handle::deleteLater<uv_tty_s_*>::anon_class_1_0_00000001::__invoke);
      }
    }
    this->m_tty = (uv_tty_t *)0x0;
  }
  return;
}

Assistant:

void xmrig::Console::stop()
{
    if (!m_tty) {
        return;
    }

    uv_tty_reset_mode();

    Handle::close(m_tty);
    m_tty = nullptr;
}